

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O3

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::convolve
          (Distributions *this,vector<double,_std::allocator<double>_> *dist1,
          vector<double,_std::allocator<double>_> *dist2,int offset1,int offset2,int *offset_result)

{
  iterator __position;
  bool bVar1;
  vector<double,std::allocator<double>> *this_00;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer *__ptr;
  long lVar5;
  uint uVar6;
  long lVar7;
  size_type __new_size;
  pointer pdVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  double *pdVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double p;
  double local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  this_00 = (vector<double,std::allocator<double>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(vector<double,std::allocator<double>> **)this = this_00;
  *offset_result = offset1 + offset2;
  pdVar2 = (dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (dist1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)pdVar3 - (long)pdVar2 >> 3;
  pdVar4 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)pdVar8 - (long)pdVar4 >> 3;
  local_38 = dist1;
  if ((int)lVar9 + (int)lVar7 < 2) {
    __new_size = 0;
  }
  else {
    lVar5 = -8;
    uVar15 = 0xffffffff;
    lVar14 = 0;
    do {
      local_40 = 0.0;
      uVar13 = (uint)lVar14;
      iVar11 = uVar13 - (int)lVar9;
      if (iVar11 < 0) {
        iVar11 = -1;
      }
      uVar6 = (int)lVar7 - 1;
      if ((int)uVar13 <= (int)uVar6) {
        uVar6 = uVar13;
      }
      dVar16 = 0.0;
      if (iVar11 < (int)uVar6) {
        lVar7 = -(int)lVar9 + lVar14;
        if (lVar7 < 0) {
          lVar7 = -1;
        }
        pdVar12 = (double *)(lVar5 + lVar7 * -8 + (long)pdVar4);
        do {
          lVar9 = lVar7 + 1;
          lVar7 = lVar7 + 1;
          dVar16 = dVar16 + pdVar2[lVar9] * *pdVar12;
          pdVar12 = pdVar12 + -1;
          local_40 = dVar16;
        } while (lVar7 < (long)(ulong)uVar6);
      }
      __position._M_current = *(double **)(this_00 + 8);
      if ((((long)__position._M_current - *(long *)this_00 != 0) || (local_40 != 0.0)) ||
         (NAN(local_40))) {
        uVar10 = (ulong)((long)__position._M_current - *(long *)this_00) >> 3;
        if (local_40 != 0.0) {
          uVar15 = uVar10 & 0xffffffff;
        }
        if (NAN(local_40)) {
          uVar15 = uVar10 & 0xffffffff;
        }
        if (__position._M_current == *(double **)(this_00 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (this_00,__position,&local_40);
          pdVar2 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar4 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (dist2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = local_40;
          *(double **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      else {
        *offset_result = *offset_result + 1;
      }
      lVar7 = (long)pdVar3 - (long)pdVar2 >> 3;
      lVar9 = (long)pdVar8 - (long)pdVar4 >> 3;
      lVar5 = lVar5 + 8;
      bVar1 = lVar14 < (int)lVar9 + (int)lVar7 + -2;
      lVar14 = lVar14 + 1;
    } while (bVar1);
    __new_size = (size_type)((int)uVar15 + 1);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,__new_size);
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::convolve(const vector<double>& dist1, const vector<double>& dist2, int offset1, int offset2, int* offset_result) {
	unique_ptr<vector<double> > result(new vector<double>());
	*offset_result = offset1 + offset2;
	int rightmost_nonzero = -1;
	for (int n = 0; n <= ((int)(dist1.size()+dist2.size()))-2; ++n) {
		double p = 0.0;
		for (int i = max(0, n-((int)dist2.size())+1); i <= min(n, ((int)dist1.size())-1); ++i) {
			p += dist1[i]*dist2[n-i];
		}
		if ((result->size() == 0) && (p == 0.0)) {
			*offset_result += 1;
			continue;
		}
		if (p != 0.0) {
			rightmost_nonzero = result->size();
		}
		result->push_back(p);
	}
	result->resize(rightmost_nonzero+1);
	return result;
}